

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbisetb.cpp
# Opt level: O1

UChar32 __thiscall icu_63::RBBISetBuilder::getFirstChar(RBBISetBuilder *this,int32_t category)

{
  RangeDescriptor *pRVar1;
  
  pRVar1 = this->fRangeList;
  while( true ) {
    if (pRVar1 == (RangeDescriptor *)0x0) {
      return -1;
    }
    if (pRVar1->fNum == category) break;
    pRVar1 = pRVar1->fNext;
  }
  return pRVar1->fStartChar;
}

Assistant:

UChar32  RBBISetBuilder::getFirstChar(int32_t category) const {
    RangeDescriptor   *rlRange;
    UChar32            retVal = (UChar32)-1;
    for (rlRange = fRangeList; rlRange!=0; rlRange=rlRange->fNext) {
        if (rlRange->fNum == category) {
            retVal = rlRange->fStartChar;
            break;
        }
    }
    return retVal;
}